

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser.cc
# Opt level: O0

bool __thiscall ManifestParser::ParseRule(ManifestParser *this,string *err)

{
  pointer *key_00;
  bool bVar1;
  bool bVar2;
  Rule *pRVar3;
  mapped_type *pmVar4;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  key_type local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  key_type local_180;
  allocator<char> local_159;
  key_type local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [8];
  EvalString value;
  string key;
  Rule *rule;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  int local_78;
  allocator<char> local_71;
  string local_70;
  undefined1 local_40 [8];
  string name;
  string *err_local;
  ManifestParser *this_local;
  
  name.field_2._8_8_ = err;
  std::__cxx11::string::string((string *)local_40);
  bVar1 = Lexer::ReadIdent(&(this->super_Parser).lexer_,(string *)local_40);
  if (bVar1) {
    bVar1 = Parser::ExpectToken(&this->super_Parser,NEWLINE,(string *)name.field_2._8_8_);
    if (bVar1) {
      pRVar3 = BindingEnv::LookupRuleCurrentScope(this->env_,(string *)local_40);
      if (pRVar3 == (Rule *)0x0) {
        pRVar3 = (Rule *)operator_new(0x50);
        Rule::Rule(pRVar3,(string *)local_40);
        do {
          bVar1 = Lexer::PeekToken(&(this->super_Parser).lexer_,INDENT);
          if (!bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_158,"rspfile",&local_159);
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString>_>_>
                     ::operator[](&pRVar3->bindings_,&local_158);
            bVar1 = EvalString::empty(pmVar4);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_180,"rspfile_content",&local_181);
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString>_>_>
                     ::operator[](&pRVar3->bindings_,&local_180);
            bVar2 = EvalString::empty(pmVar4);
            std::__cxx11::string::~string((string *)&local_180);
            std::allocator<char>::~allocator(&local_181);
            std::__cxx11::string::~string((string *)&local_158);
            std::allocator<char>::~allocator(&local_159);
            if (bVar1 == bVar2) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1d0,"command",&local_1d1);
              pmVar4 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString>_>_>
                       ::operator[](&pRVar3->bindings_,&local_1d0);
              bVar1 = EvalString::empty(pmVar4);
              std::__cxx11::string::~string((string *)&local_1d0);
              std::allocator<char>::~allocator(&local_1d1);
              if (bVar1) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1f8,"expected \'command =\' line",&local_1f9);
                this_local._7_1_ =
                     Lexer::Error(&(this->super_Parser).lexer_,&local_1f8,
                                  (string *)name.field_2._8_8_);
                std::__cxx11::string::~string((string *)&local_1f8);
                std::allocator<char>::~allocator(&local_1f9);
                local_78 = 1;
              }
              else {
                BindingEnv::AddRule(this->env_,pRVar3);
                this_local._7_1_ = 1;
                local_78 = 1;
              }
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1a8,
                         "rspfile and rspfile_content need to be both specified",&local_1a9);
              this_local._7_1_ =
                   Lexer::Error(&(this->super_Parser).lexer_,&local_1a8,(string *)name.field_2._8_8_
                               );
              std::__cxx11::string::~string((string *)&local_1a8);
              std::allocator<char>::~allocator(&local_1a9);
              local_78 = 1;
            }
            break;
          }
          key_00 = &value.parsed_.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          std::__cxx11::string::string((string *)key_00);
          EvalString::EvalString((EvalString *)local_f8);
          bVar1 = ParseLet(this,(string *)key_00,(EvalString *)local_f8,(string *)name.field_2._8_8_
                          );
          if (bVar1) {
            bVar1 = Rule::IsReservedBinding
                              ((string *)
                               &value.parsed_.
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (bVar1) {
              Rule::AddBinding(pRVar3,(string *)
                                      &value.parsed_.
                                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (EvalString *)local_f8);
              local_78 = 0;
            }
            else {
              std::operator+(&local_138,"unexpected variable \'",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &value.parsed_.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::operator+(&local_118,&local_138,"\'");
              this_local._7_1_ =
                   Lexer::Error(&(this->super_Parser).lexer_,&local_118,(string *)name.field_2._8_8_
                               );
              std::__cxx11::string::~string((string *)&local_118);
              std::__cxx11::string::~string((string *)&local_138);
              local_78 = 1;
            }
          }
          else {
            this_local._7_1_ = 0;
            local_78 = 1;
          }
          EvalString::~EvalString((EvalString *)local_f8);
          std::__cxx11::string::~string
                    ((string *)
                     &value.parsed_.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        } while (local_78 == 0);
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rule,
                       "duplicate rule \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                      );
        std::operator+(&local_98,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rule,
                       "\'");
        this_local._7_1_ =
             Lexer::Error(&(this->super_Parser).lexer_,&local_98,(string *)name.field_2._8_8_);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&rule);
        local_78 = 1;
      }
    }
    else {
      this_local._7_1_ = 0;
      local_78 = 1;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"expected rule name",&local_71);
    this_local._7_1_ =
         Lexer::Error(&(this->super_Parser).lexer_,&local_70,(string *)name.field_2._8_8_);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    local_78 = 1;
  }
  std::__cxx11::string::~string((string *)local_40);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ManifestParser::ParseRule(string* err) {
  string name;
  if (!lexer_.ReadIdent(&name))
    return lexer_.Error("expected rule name", err);

  if (!ExpectToken(Lexer::NEWLINE, err))
    return false;

  if (env_->LookupRuleCurrentScope(name) != NULL)
    return lexer_.Error("duplicate rule '" + name + "'", err);

  Rule* rule = new Rule(name);  // XXX scoped_ptr

  while (lexer_.PeekToken(Lexer::INDENT)) {
    string key;
    EvalString value;
    if (!ParseLet(&key, &value, err))
      return false;

    if (Rule::IsReservedBinding(key)) {
      rule->AddBinding(key, value);
    } else {
      // Die on other keyvals for now; revisit if we want to add a
      // scope here.
      return lexer_.Error("unexpected variable '" + key + "'", err);
    }
  }

  if (rule->bindings_["rspfile"].empty() !=
      rule->bindings_["rspfile_content"].empty()) {
    return lexer_.Error("rspfile and rspfile_content need to be "
                        "both specified", err);
  }

  if (rule->bindings_["command"].empty())
    return lexer_.Error("expected 'command =' line", err);

  env_->AddRule(rule);
  return true;
}